

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell_corrector.cpp
# Opt level: O1

void __thiscall
NJamSpell::TSpellCorrector::FilterCandidatesByFrequency
          (TSpellCorrector *this,
          unordered_set<NJamSpell::TWord,_NJamSpell::TWordHashPtr,_std::equal_to<NJamSpell::TWord>,_std::allocator<NJamSpell::TWord>_>
          *uniqueCandidates,TWord origWord)

{
  _Hash_node_base *p_Var1;
  size_t sVar2;
  TWordId wid;
  TCount TVar3;
  long lVar4;
  unordered_set<NJamSpell::TWord,_NJamSpell::TWordHashPtr,_std::equal_to<NJamSpell::TWord>,_std::allocator<NJamSpell::TWord>_>
  *__range1;
  ulong uVar5;
  wchar_t *local_78;
  TWord origWord_local;
  vector<std::pair<unsigned_int,_NJamSpell::TWord>,_std::allocator<std::pair<unsigned_int,_NJamSpell::TWord>_>_>
  candidateCounts;
  unordered_set<NJamSpell::TWord,_NJamSpell::TWordHashPtr,_std::equal_to<NJamSpell::TWord>,_std::allocator<NJamSpell::TWord>_>
  *puStack_48;
  __node_gen_type __node_gen;
  pointer pvStack_38;
  
  origWord_local.Ptr = (wchar_t *)origWord.Len;
  local_78 = origWord.Ptr;
  if (this->MaxCandidatesToCheck < (uniqueCandidates->_M_h)._M_element_count) {
    origWord_local.Len = 0;
    candidateCounts.
    super__Vector_base<std::pair<unsigned_int,_NJamSpell::TWord>,_std::allocator<std::pair<unsigned_int,_NJamSpell::TWord>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    for (p_Var1 = (uniqueCandidates->_M_h)._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
        p_Var1 = p_Var1->_M_nxt) {
      wid = TLangModel::GetWordIdNoCreate(&this->LangModel,(TWord *)(p_Var1 + 1));
      TVar3 = TLangModel::GetWordCount(&this->LangModel,wid);
      puStack_48 = (unordered_set<NJamSpell::TWord,_NJamSpell::TWordHashPtr,_std::equal_to<NJamSpell::TWord>,_std::allocator<NJamSpell::TWord>_>
                    *)CONCAT44(puStack_48._4_4_,TVar3);
      __node_gen._M_h = (__hashtable_alloc *)((TWord *)(p_Var1 + 1))->Ptr;
      pvStack_38 = (pointer)p_Var1[2]._M_nxt;
      if (candidateCounts.
          super__Vector_base<std::pair<unsigned_int,_NJamSpell::TWord>,_std::allocator<std::pair<unsigned_int,_NJamSpell::TWord>_>_>
          ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
        std::
        vector<std::pair<unsigned_int,NJamSpell::TWord>,std::allocator<std::pair<unsigned_int,NJamSpell::TWord>>>
        ::_M_realloc_insert<std::pair<unsigned_int,NJamSpell::TWord>>
                  ((vector<std::pair<unsigned_int,NJamSpell::TWord>,std::allocator<std::pair<unsigned_int,NJamSpell::TWord>>>
                    *)&origWord_local.Len,(iterator)0x0,
                   (pair<unsigned_int,_NJamSpell::TWord> *)&stack0xffffffffffffffb8);
      }
      else {
        ((candidateCounts.
          super__Vector_base<std::pair<unsigned_int,_NJamSpell::TWord>,_std::allocator<std::pair<unsigned_int,_NJamSpell::TWord>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->second).Len = (size_t)pvStack_38;
        *(unordered_set<NJamSpell::TWord,_NJamSpell::TWordHashPtr,_std::equal_to<NJamSpell::TWord>,_std::allocator<NJamSpell::TWord>_>
          **)candidateCounts.
             super__Vector_base<std::pair<unsigned_int,_NJamSpell::TWord>,_std::allocator<std::pair<unsigned_int,_NJamSpell::TWord>_>_>
             ._M_impl.super__Vector_impl_data._M_start = puStack_48;
        ((candidateCounts.
          super__Vector_base<std::pair<unsigned_int,_NJamSpell::TWord>,_std::allocator<std::pair<unsigned_int,_NJamSpell::TWord>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->second).Ptr = (wchar_t *)__node_gen._M_h;
        candidateCounts.
        super__Vector_base<std::pair<unsigned_int,_NJamSpell::TWord>,_std::allocator<std::pair<unsigned_int,_NJamSpell::TWord>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             candidateCounts.
             super__Vector_base<std::pair<unsigned_int,_NJamSpell::TWord>,_std::allocator<std::pair<unsigned_int,_NJamSpell::TWord>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1;
      }
    }
    std::
    _Hashtable<NJamSpell::TWord,_NJamSpell::TWord,_std::allocator<NJamSpell::TWord>,_std::__detail::_Identity,_std::equal_to<NJamSpell::TWord>,_NJamSpell::TWordHashPtr,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::clear(&uniqueCandidates->_M_h);
    sVar2 = origWord_local.Len;
    if ((pointer)origWord_local.Len !=
        candidateCounts.
        super__Vector_base<std::pair<unsigned_int,_NJamSpell::TWord>,_std::allocator<std::pair<unsigned_int,_NJamSpell::TWord>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      lVar4 = ((long)((long)candidateCounts.
                            super__Vector_base<std::pair<unsigned_int,_NJamSpell::TWord>,_std::allocator<std::pair<unsigned_int,_NJamSpell::TWord>_>_>
                            ._M_impl.super__Vector_impl_data._M_start - origWord_local.Len) >> 3) *
              -0x5555555555555555;
      std::
      _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,_NJamSpell::TWord>_*,_std::vector<std::pair<unsigned_int,_NJamSpell::TWord>,_std::allocator<std::pair<unsigned_int,_NJamSpell::TWord>_>_>_>,_std::pair<unsigned_int,_NJamSpell::TWord>_>
      ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,_NJamSpell::TWord>_*,_std::vector<std::pair<unsigned_int,_NJamSpell::TWord>,_std::allocator<std::pair<unsigned_int,_NJamSpell::TWord>_>_>_>,_std::pair<unsigned_int,_NJamSpell::TWord>_>
                           *)&stack0xffffffffffffffb8,
                          (__normal_iterator<std::pair<unsigned_int,_NJamSpell::TWord>_*,_std::vector<std::pair<unsigned_int,_NJamSpell::TWord>,_std::allocator<std::pair<unsigned_int,_NJamSpell::TWord>_>_>_>
                           )origWord_local.Len,(lVar4 - (lVar4 + 1 >> 0x3f)) + 1 >> 1);
      if (pvStack_38 == (pointer)0x0) {
        std::
        __inplace_stable_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,NJamSpell::TWord>*,std::vector<std::pair<unsigned_int,NJamSpell::TWord>,std::allocator<std::pair<unsigned_int,NJamSpell::TWord>>>>,__gnu_cxx::__ops::_Iter_comp_iter<NJamSpell::TSpellCorrector::FilterCandidatesByFrequency(std::unordered_set<NJamSpell::TWord,NJamSpell::TWordHashPtr,std::equal_to<NJamSpell::TWord>,std::allocator<NJamSpell::TWord>>&,NJamSpell::TWord)const::__0>>
                  (sVar2,candidateCounts.
                         super__Vector_base<std::pair<unsigned_int,_NJamSpell::TWord>,_std::allocator<std::pair<unsigned_int,_NJamSpell::TWord>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
      }
      else {
        std::
        __stable_sort_adaptive<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,NJamSpell::TWord>*,std::vector<std::pair<unsigned_int,NJamSpell::TWord>,std::allocator<std::pair<unsigned_int,NJamSpell::TWord>>>>,std::pair<unsigned_int,NJamSpell::TWord>*,long,__gnu_cxx::__ops::_Iter_comp_iter<NJamSpell::TSpellCorrector::FilterCandidatesByFrequency(std::unordered_set<NJamSpell::TWord,NJamSpell::TWordHashPtr,std::equal_to<NJamSpell::TWord>,std::allocator<NJamSpell::TWord>>&,NJamSpell::TWord)const::__0>>
                  (sVar2,candidateCounts.
                         super__Vector_base<std::pair<unsigned_int,_NJamSpell::TWord>,_std::allocator<std::pair<unsigned_int,_NJamSpell::TWord>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,pvStack_38,__node_gen._M_h);
      }
      operator_delete(pvStack_38);
    }
    if (this->MaxCandidatesToCheck != 0) {
      lVar4 = 8;
      uVar5 = 0;
      do {
        puStack_48 = uniqueCandidates;
        std::
        _Hashtable<NJamSpell::TWord,NJamSpell::TWord,std::allocator<NJamSpell::TWord>,std::__detail::_Identity,std::equal_to<NJamSpell::TWord>,NJamSpell::TWordHashPtr,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<NJamSpell::TWord_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<NJamSpell::TWord,true>>>>
                  ((_Hashtable<NJamSpell::TWord,NJamSpell::TWord,std::allocator<NJamSpell::TWord>,std::__detail::_Identity,std::equal_to<NJamSpell::TWord>,NJamSpell::TWordHashPtr,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)uniqueCandidates,origWord_local.Len + lVar4,&stack0xffffffffffffffb8);
        uVar5 = uVar5 + 1;
        lVar4 = lVar4 + 0x18;
      } while (uVar5 < this->MaxCandidatesToCheck);
    }
    puStack_48 = uniqueCandidates;
    std::
    _Hashtable<NJamSpell::TWord,NJamSpell::TWord,std::allocator<NJamSpell::TWord>,std::__detail::_Identity,std::equal_to<NJamSpell::TWord>,NJamSpell::TWordHashPtr,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<NJamSpell::TWord_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<NJamSpell::TWord,true>>>>
              ((_Hashtable<NJamSpell::TWord,NJamSpell::TWord,std::allocator<NJamSpell::TWord>,std::__detail::_Identity,std::equal_to<NJamSpell::TWord>,NJamSpell::TWordHashPtr,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)uniqueCandidates,&local_78);
    if (origWord_local.Len != 0) {
      operator_delete((void *)origWord_local.Len);
    }
  }
  return;
}

Assistant:

void TSpellCorrector::FilterCandidatesByFrequency(std::unordered_set<TWord, TWordHashPtr>& uniqueCandidates, TWord origWord) const {
    if (uniqueCandidates.size() <= MaxCandidatesToCheck) {
        return;
    }

    using TCountCand = std::pair<TCount, TWord>;
    std::vector<TCountCand> candidateCounts;
    for (auto&& c: uniqueCandidates) {
        TCount cnt = LangModel.GetWordCount(LangModel.GetWordIdNoCreate(c));
        candidateCounts.push_back(std::make_pair(cnt, c));
    }
    uniqueCandidates.clear();
    std::stable_sort(candidateCounts.begin(), candidateCounts.end(), [](const TCountCand& a, const TCountCand& b) {
        return a.first > b.first;
    });

    for (size_t i = 0; i < MaxCandidatesToCheck; ++ i) {
        uniqueCandidates.insert(candidateCounts[i].second);
    }
    uniqueCandidates.insert(origWord);
}